

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::fixup_image_load_store_access(CompilerGLSL *this)

{
  anon_class_8_1_8991fb9c local_18;
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  if (((this->options).enable_storage_image_qualifier_deduction & 1U) != 0) {
    local_18.this = this;
    local_10 = this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::fixup_image_load_store_access()::__0>
              (&(this->super_Compiler).ir,&local_18);
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_image_load_store_access()
{
	if (!options.enable_storage_image_qualifier_deduction)
		return;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var, const SPIRVariable &) {
		auto &vartype = expression_type(var);
		if (vartype.basetype == SPIRType::Image && vartype.image.sampled == 2)
		{
			// Very old glslangValidator and HLSL compilers do not emit required qualifiers here.
			// Solve this by making the image access as restricted as possible and loosen up if we need to.
			// If any no-read/no-write flags are actually set, assume that the compiler knows what it's doing.

			if (!has_decoration(var, DecorationNonWritable) && !has_decoration(var, DecorationNonReadable))
			{
				set_decoration(var, DecorationNonWritable);
				set_decoration(var, DecorationNonReadable);
			}
		}
	});
}